

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O0

void ds_list_destroy(DsList **plist)

{
  DsList *__ptr;
  DsListEntry *pDVar1;
  DsListEntry *temp;
  DsListEntry *entry;
  DsList *list;
  DsList **plist_local;
  
  if (*plist != (DsList *)0x0) {
    __ptr = *plist;
    temp = __ptr->entry;
    while (temp != (DsListEntry *)0x0) {
      pDVar1 = temp->next;
      free(temp);
      temp = pDVar1;
    }
    free(__ptr);
    *plist = (DsList *)0x0;
  }
  return;
}

Assistant:

void ds_list_destroy(DsList **plist)
{
    if (*plist)
    {
        DsList *list = *plist;
        DsListEntry *entry = list->entry;
        while (entry)
        {
            DsListEntry *temp = entry;
            entry = entry->next;
            free(temp);
        }
        free(list);
        *plist = NULL;
    }
    return;
}